

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

Maybe<kj::Own<kj::_::Event>_> __thiscall kj::TaskSet::Task::fire(Task *this)

{
  EventPort *pEVar1;
  _func_int **pp_Var2;
  EventLoop *pEVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  Disposer *pDVar6;
  TaskSet *pTVar7;
  long lVar8;
  undefined8 *puVar9;
  long *plVar10;
  Event *extraout_RDX;
  Event *extraout_RDX_00;
  Event *pEVar11;
  Event *extraout_RDX_01;
  EventLoop *in_RSI;
  Maybe<kj::Own<kj::_::Event>_> MVar12;
  NullableValue<kj::Exception> exception;
  Fault f;
  ExceptionOr<kj::_::Void> result;
  Runnable local_458;
  Exception EStack_450;
  NullableValue<kj::Exception> local_2f8;
  char local_198;
  Exception local_190;
  undefined1 local_38;
  
  local_198 = '\0';
  local_38 = 0;
  (*(code *)(*in_RSI[1].tail)->next)();
  local_458._vptr_Runnable = (_func_int **)&PTR_run_0064d088;
  EStack_450.ownFile.content.ptr = (char *)in_RSI;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_2f8,&local_458);
  local_458._vptr_Runnable._0_1_ = local_2f8.isSet;
  if (local_2f8.isSet == true) {
    EStack_450.ownFile.content.ptr = local_2f8.field_1.value.ownFile.content.ptr;
    EStack_450.ownFile.content.size_ = local_2f8.field_1.value.ownFile.content.size_;
    EStack_450.ownFile.content.disposer = local_2f8.field_1.value.ownFile.content.disposer;
    local_2f8.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_2f8.field_1.value.ownFile.content.size_ = 0;
    EStack_450.file = local_2f8.field_1.value.file;
    EStack_450.line = local_2f8.field_1.value.line;
    EStack_450.type = local_2f8.field_1.value.type;
    EStack_450.description.content.ptr = local_2f8.field_1.value.description.content.ptr;
    EStack_450.description.content.size_ = local_2f8.field_1.value.description.content.size_;
    EStack_450.description.content.disposer = local_2f8.field_1.value.description.content.disposer;
    EStack_450.context.ptr.disposer = local_2f8.field_1.value.context.ptr.disposer;
    local_2f8.field_1.value.description.content.ptr = (char *)0x0;
    local_2f8.field_1.value.description.content.size_ = 0;
    EStack_450.context.ptr.ptr = local_2f8.field_1.value.context.ptr.ptr;
    local_2f8.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(EStack_450.trace,(void *)((long)&local_2f8.field_1 + 0x50),0x104);
    Exception::~Exception(&local_2f8.field_1.value);
  }
  if ((char)local_458._vptr_Runnable == '\x01') {
    if (local_198 == '\0') {
      local_190.ownFile.content.ptr = EStack_450.ownFile.content.ptr;
      local_190.ownFile.content.size_ = EStack_450.ownFile.content.size_;
      local_190.ownFile.content.disposer = EStack_450.ownFile.content.disposer;
      EStack_450.ownFile.content.ptr = (char *)0x0;
      EStack_450.ownFile.content.size_ = 0;
      local_190.file = EStack_450.file;
      local_190.line = EStack_450.line;
      local_190.type = EStack_450.type;
      local_190.description.content.ptr = EStack_450.description.content.ptr;
      local_190.description.content.size_ = EStack_450.description.content.size_;
      local_190.description.content.disposer = EStack_450.description.content.disposer;
      EStack_450.description.content.ptr = (char *)0x0;
      EStack_450.description.content.size_ = 0;
      local_190.context.ptr.disposer = EStack_450.context.ptr.disposer;
      local_190.context.ptr.ptr = EStack_450.context.ptr.ptr;
      EStack_450.context.ptr.ptr = (Context *)0x0;
      memcpy(local_190.trace,EStack_450.trace,0x104);
      local_198 = '\x01';
    }
    Exception::~Exception(&EStack_450);
  }
  if (local_198 == '\x01') {
    (*(code *)**(undefined8 **)**(undefined8 **)&in_RSI[1].running)
              ((undefined8 *)**(undefined8 **)&in_RSI[1].running,&local_190);
  }
  if ((in_RSI->daemons).ptr != (TaskSet *)0x0) {
    (in_RSI->daemons).ptr[1].tasks.ptr.ptr = (Task *)in_RSI[1].port;
  }
  pEVar1 = in_RSI[1].port;
  if ((pEVar1 != (EventPort *)0x0) && (pEVar1[1]._vptr_EventPort != (_func_int **)0x0)) {
    pp_Var2 = pEVar1->_vptr_EventPort;
    pEVar3 = (EventLoop *)pEVar1[1]._vptr_EventPort;
    pEVar1[1]._vptr_EventPort = (_func_int **)0x0;
    if (pEVar3 != in_RSI) {
      local_2f8.isSet = false;
      local_2f8._1_7_ = 0;
      local_458._vptr_Runnable = (_func_int **)0x0;
      EStack_450.ownFile.content.ptr = (char *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_2f8,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_2f8);
    }
    pp_Var4 = pEVar1->_vptr_EventPort;
    pp_Var5 = pEVar1[1]._vptr_EventPort;
    pEVar1->_vptr_EventPort = (_func_int **)(in_RSI->daemons).disposer;
    pEVar1[1]._vptr_EventPort = (_func_int **)(in_RSI->daemons).ptr;
    (in_RSI->daemons).ptr = (TaskSet *)0x0;
    if (pp_Var5 != (_func_int **)0x0) {
      (**(code **)*pp_Var4)(pp_Var4,(long)pp_Var5 + *(long *)(*pp_Var5 + -0x10));
    }
    pDVar6 = (in_RSI->daemons).disposer;
    pTVar7 = (in_RSI->daemons).ptr;
    (in_RSI->daemons).disposer = (Disposer *)0x0;
    (in_RSI->daemons).ptr = (TaskSet *)0x0;
    if (pTVar7 != (TaskSet *)0x0) {
      (**pDVar6->_vptr_Disposer)
                (pDVar6,(long)&pTVar7->errorHandler +
                        (long)pTVar7->errorHandler[-2]._vptr_ErrorHandler);
    }
    in_RSI[1].port = (EventPort *)0x0;
    lVar8 = *(long *)&in_RSI[1].running;
    pEVar11 = *(Event **)(lVar8 + 0x20);
    if ((pEVar11 != (Event *)0x0) && (*(long *)(lVar8 + 0x10) == 0)) {
      (**(code **)**(undefined8 **)(lVar8 + 0x20))(*(undefined8 **)(lVar8 + 0x20),&local_458);
      lVar8 = *(long *)&in_RSI[1].running;
      puVar9 = *(undefined8 **)(lVar8 + 0x18);
      plVar10 = *(long **)(lVar8 + 0x20);
      *(undefined8 *)(lVar8 + 0x18) = 0;
      *(undefined8 *)(lVar8 + 0x20) = 0;
      pEVar11 = extraout_RDX;
      if (plVar10 != (long *)0x0) {
        (**(code **)*puVar9)(puVar9,(long)plVar10 + *(long *)(*plVar10 + -0x10));
        pEVar11 = extraout_RDX_00;
      }
    }
    (this->super_Event)._vptr_Event = pp_Var2;
    (this->super_Event).loop = pEVar3;
    if (local_198 == '\x01') {
      Exception::~Exception(&local_190);
      pEVar11 = extraout_RDX_01;
    }
    MVar12.ptr.ptr = pEVar11;
    MVar12.ptr.disposer = (Disposer *)this;
    return (Maybe<kj::Own<kj::_::Event>_>)MVar12.ptr;
  }
  local_2f8.isSet = false;
  local_2f8._1_7_ = 0;
  local_458._vptr_Runnable = (_func_int **)0x0;
  EStack_450.ownFile.content.ptr = (char *)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)&local_2f8,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
            );
  kj::_::Debug::Fault::fatal((Fault *)&local_2f8);
}

Assistant:

Maybe<Own<Event>> fire() override {
    // Get the result.
    _::ExceptionOr<_::Void> result;
    node->get(result);

    // Delete the node, catching any exceptions.
    KJ_IF_MAYBE(exception, kj::runCatchingExceptions([this]() {
      node = nullptr;
    })) {
      result.addException(kj::mv(*exception));
    }

    // Call the error handler if there was an exception.
    KJ_IF_MAYBE(e, result.exception) {
      taskSet.errorHandler.taskFailed(kj::mv(*e));
    }

    // Remove from the task list.
    KJ_IF_MAYBE(n, next) {
      n->get()->prev = prev;
    }
    Own<Event> self = kj::mv(KJ_ASSERT_NONNULL(*prev));
    KJ_ASSERT(self.get() == this);
    *prev = kj::mv(next);
    next = nullptr;
    prev = nullptr;

    KJ_IF_MAYBE(f, taskSet.emptyFulfiller) {
      if (taskSet.tasks == nullptr) {
        f->get()->fulfill();
        taskSet.emptyFulfiller = nullptr;
      }
    }

    return mv(self);
  }